

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fifo_path_common.cpp
# Opt level: O2

void __thiscall
pstore::brokerface::fifo_path::fifo_path
          (fifo_path *this,czstring pipe_path,duration_type retry_timeout,uint max_retries,
          update_callback *cb)

{
  allocator local_21;
  
  *(undefined8 *)
   ((long)&(this->open_server_pipe_mut_).super___mutex_base._M_mutex.__data.__list.__prev + 1) = 0;
  *(undefined8 *)
   ((long)&(this->open_server_pipe_mut_).super___mutex_base._M_mutex.__data.__list.__next + 1) = 0;
  *(undefined8 *)((long)&(this->open_server_pipe_mut_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->open_server_pipe_mut_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->open_server_pipe_mut_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->open_server_pipe_mut_).super___mutex_base._M_mutex + 8) = 0;
  if (pipe_path == (czstring)0x0) {
    get_default_path_abi_cxx11_();
  }
  else {
    std::__cxx11::string::string((string *)&this->path_,pipe_path,&local_21);
  }
  (this->retry_timeout_).__r = retry_timeout.__r;
  this->max_retries_ = max_retries;
  std::function<void_(pstore::brokerface::fifo_path::operation)>::function(&this->update_cb_,cb);
  return;
}

Assistant:

fifo_path::fifo_path (gsl::czstring const pipe_path, duration_type const retry_timeout,
                              unsigned const max_retries, update_callback cb)
                : path_{pipe_path == nullptr ? get_default_path () : pipe_path}
                , retry_timeout_{retry_timeout}
                , max_retries_{max_retries}
                , update_cb_{std::move (cb)} {}